

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeString::tempSubString
          (UnicodeString *__return_storage_ptr__,UnicodeString *this,int32_t start,int32_t len)

{
  ConstChar16Ptr local_30;
  char16_t *local_28;
  UChar *array;
  int32_t len_local;
  int32_t start_local;
  UnicodeString *this_local;
  
  array._0_4_ = len;
  array._4_4_ = start;
  _len_local = this;
  this_local = __return_storage_ptr__;
  pinIndices(this,(int32_t *)((long)&array + 4),(int32_t *)&array);
  local_28 = getBuffer(this);
  if (local_28 == (char16_t *)0x0) {
    local_28 = (this->fUnion).fStackFields.fBuffer;
    array._0_4_ = -2;
  }
  ConstChar16Ptr::ConstChar16Ptr(&local_30,local_28 + array._4_4_);
  UnicodeString(__return_storage_ptr__,'\0',&local_30,(int32_t)array);
  ConstChar16Ptr::~ConstChar16Ptr(&local_30);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
UnicodeString::tempSubString(int32_t start, int32_t len) const {
  pinIndices(start, len);
  const UChar *array = getBuffer();  // not getArrayStart() to check kIsBogus & kOpenGetBuffer
  if(array==NULL) {
    array=fUnion.fStackFields.fBuffer;  // anything not NULL because that would make an empty string
    len=-2;  // bogus result string
  }
  return UnicodeString(FALSE, array + start, len);
}